

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

SmallBuffer * helics::typeConvert(DataType type,string_view val)

{
  string_view val_00;
  string_view valname;
  string_view val_01;
  string_view val_02;
  string_view val_03;
  bool bVar1;
  string *__a;
  SmallBuffer *this;
  reference other;
  char *in_RCX;
  size_t in_RDX;
  undefined4 in_ESI;
  SmallBuffer *in_RDI;
  json json;
  nullptr_t in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined7 uVar2;
  undefined1 in_stack_fffffffffffffdc7;
  undefined1 hexConvert;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffdc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdd0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *this_00;
  NamedPoint *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val_04;
  NamedPoint *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  char *in_stack_fffffffffffffdf0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffe10;
  DataType in_stack_fffffffffffffe3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a9;
  undefined1 local_188 [8];
  string_view in_stack_fffffffffffffe80;
  char local_140 [24];
  size_t local_128;
  char *pcStack_120;
  size_t local_e8;
  char *pcStack_e0;
  size_t local_b0;
  char *local_a8;
  size_t local_90;
  undefined8 in_stack_ffffffffffffff78;
  TimeRepresentation<count_time<9,_long>_> local_60;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_len = in_RDX;
  local_18._M_str = in_RCX;
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (bVar1) {
    emptyBlock((DataType)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               (DataType)in_stack_ffffffffffffff78);
  }
  else {
    switch(in_ESI) {
    case 0:
    case 9:
    default:
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdd8);
      break;
    case 1:
      getDoubleFromString(in_stack_fffffffffffffe80);
      ValueConverter<double>::convert((double *)in_stack_fffffffffffffdd8);
      break;
    case 2:
      getDoubleFromString(in_stack_fffffffffffffe80);
      ValueConverter<long>::convert((long *)in_stack_fffffffffffffdd8);
      break;
    case 3:
      local_90 = local_18._M_len;
      val_03._M_str = in_stack_ffffffffffffffb0;
      val_03._M_len = in_stack_ffffffffffffffa8;
      helicsGetComplex(val_03);
      ValueConverter<std::complex<double>_>::convert((complex<double> *)in_stack_fffffffffffffdd8);
      break;
    case 4:
      val_02._M_str = local_140;
      val_02._M_len = (size_t)in_stack_fffffffffffffdf0;
      helicsGetVector(val_02);
      ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd8);
      CLI::std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0);
      break;
    case 5:
      local_128 = local_18._M_len;
      pcStack_120 = local_18._M_str;
      val_01._M_str = (char *)in_stack_fffffffffffffdf8;
      val_01._M_len = (size_t)in_stack_fffffffffffffdf0;
      helicsGetComplexVector(val_01);
      ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
      convert((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
              in_stack_fffffffffffffdd8);
      CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffdd0);
      break;
    case 6:
      local_e8 = local_18._M_len;
      pcStack_e0 = local_18._M_str;
      nan("0");
      valname._M_len._4_4_ = in_stack_fffffffffffffdec;
      valname._M_len._0_4_ = in_stack_fffffffffffffde8;
      valname._M_str = in_stack_fffffffffffffdf0;
      NamedPoint::NamedPoint(in_stack_fffffffffffffde0,valname,(double)in_stack_fffffffffffffdd8);
      ValueConverter<helics::NamedPoint>::convert(in_stack_fffffffffffffdd8);
      NamedPoint::~NamedPoint((NamedPoint *)0x328d3b);
      break;
    case 7:
      local_b0 = local_18._M_len;
      local_a8 = local_18._M_str;
      val_00._M_len._7_1_ = in_stack_fffffffffffffdc7;
      val_00._M_len._0_7_ = in_stack_fffffffffffffdc0;
      val_00._M_str = (char *)in_stack_fffffffffffffdc8;
      helicsBoolValue(val_00);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdd8);
      break;
    case 8:
      getDoubleFromString(in_stack_fffffffffffffe80);
      TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                ((TimeRepresentation<count_time<9,_long>_> *)
                 CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 (double)in_stack_fffffffffffffdb8);
      TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode(&local_60);
      ValueConverter<long>::convert((long *)in_stack_fffffffffffffdd8);
      break;
    case 0x1e:
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                   in_stack_fffffffffffffdb8);
      __a = typeNameStringRef_abi_cxx11_(in_stack_fffffffffffffe3c);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffffde0,&in_stack_fffffffffffffdd8->name);
      this = (SmallBuffer *)
             nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      this_00 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)&stack0xfffffffffffffe88;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=(this_00,in_stack_fffffffffffffdc8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
      val_04 = &local_1a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(allocator<char> *)__a);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)this,val_04);
      other = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      uVar2 = SUB87(local_188,0);
      hexConvert = (undefined1)((ulong)local_188 >> 0x38);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=(this_00,other);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)CONCAT17(hexConvert,uVar2));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(hexConvert,uVar2));
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      fileops::generateJsonString(other,(bool)hexConvert);
      SmallBuffer::SmallBuffer<std::__cxx11::string,void>(this,val_04);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(hexConvert,uVar2));
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)CONCAT17(hexConvert,uVar2));
    }
  }
  return in_RDI;
}

Assistant:

SmallBuffer typeConvert(DataType type, std::string_view val)
{
    if (val.empty()) {
        return emptyBlock(type);
    }

    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(getDoubleFromString(val));
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(getDoubleFromString(val)));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(
                Time(getDoubleFromString(val)).getBaseTimeCode());
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(helicsGetComplex(val));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((helicsBoolValue(val)) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default:
            return ValueConverter<std::string_view>::convert(val);
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(NamedPoint{val, std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR:
            return ValueConverter<std::vector<std::complex<double>>>::convert(
                helicsGetComplexVector(val));
        case DataType::HELICS_VECTOR:
            return ValueConverter<std::vector<double>>::convert(helicsGetVector(val));
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_STRING);
            json["value"] = std::string(val);
            return fileops::generateJsonString(json);
        }
    }
}